

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O2

void __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::
assign_functor<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (undefined8 param_1,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,
          undefined8 *functor)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *this;
  
  this = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)operator_new(0x20);
  algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            (this,f);
  *functor = this;
  return;
}

Assistant:

void
        assign_functor(FunctionObj f, function_buffer& functor, mpl::false_) const
        {
          functor.members.obj_ptr = new FunctionObj(f);
        }